

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

ssize_t __thiscall
MT32Emu::MemoryRegion::read(MemoryRegion *this,int __fd,void *__buf,size_t __nbytes)

{
  Bit8u *pBVar1;
  void *pvVar2;
  size_t __n;
  uint uVar3;
  uint in_R8D;
  uint uVar4;
  
  uVar3 = __fd * this->entrySize + (int)__buf;
  uVar4 = this->entrySize * this->entries;
  pBVar1 = (Bit8u *)(ulong)(uVar4 - 1);
  if ((uVar3 <= uVar4 - 1) && (pBVar1 = this->realMemory, pBVar1 != (Bit8u *)0x0)) {
    __n = (size_t)(uVar4 - uVar3);
    if (uVar3 + in_R8D <= uVar4) {
      __n = (size_t)in_R8D;
    }
    pvVar2 = memcpy((void *)__nbytes,pBVar1 + uVar3,__n);
    return (ssize_t)pvVar2;
  }
  return (ssize_t)pBVar1;
}

Assistant:

void MemoryRegion::read(unsigned int entry, unsigned int off, Bit8u *dst, unsigned int len) const {
	off += entry * entrySize;
	// This method should never be called with out-of-bounds parameters,
	// or on an unsupported region - seeing any of this debug output indicates a bug in the emulator
	if (off > entrySize * entries - 1) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("read[%d]: parameters start out of bounds: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		return;
	}
	if (off + len > entrySize * entries) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("read[%d]: parameters end out of bounds: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		len = entrySize * entries - off;
	}
	Bit8u *src = getRealMemory();
	if (src == NULL) {
#if MT32EMU_MONITOR_SYSEX > 0
		synth->printDebug("read[%d]: unreadable region: entry=%d, off=%d, len=%d", type, entry, off, len);
#endif
		return;
	}
	memcpy(dst, src + off, len);
}